

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O3

void __thiscall Inferences::ContextSubsetReplacement::stepIteration(ContextSubsetReplacement *this)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  puVar2 = (this->_iteration).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->_iteration).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if (lVar4 != 0) {
    puVar3 = (this->_maxIterations).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = 1;
    uVar6 = 0;
    do {
      if (puVar3[uVar6] <= this->_maxOccurrences) {
        uVar1 = puVar2[uVar6];
        puVar2[uVar6] = uVar1 + 1;
        if (uVar1 + 1 < puVar3[uVar6]) {
          return;
        }
        puVar2[uVar6] = 1;
      }
      uVar6 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar6 < (ulong)(lVar4 >> 2));
  }
  this->_done = true;
  return;
}

Assistant:

void ContextSubsetReplacement::stepIteration()
{
  for (unsigned i = 0; i < _iteration.size(); i++) {
    if (_maxIterations[i] > _maxOccurrences) {
      continue;
    }
    _iteration[i]++;
    if (_iteration[i] < _maxIterations[i]) {
      return;
    } else {
      _iteration[i] = 1;
    }
  }
  _done = true;
}